

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O2

bool dxil_spv::emit_sample_index_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Operation *this;
  Builder *this_00;
  
  arg = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSampleId);
  this = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
  Operation::add_id(this,arg);
  Converter::Impl::add(impl,this,false);
  this_00 = Converter::Impl::builder(impl);
  spv::Builder::addCapability(this_00,CapabilitySampleRateShading);
  return true;
}

Assistant:

bool emit_sample_index_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSampleId);
	Operation *op = impl.allocate(spv::OpLoad, instruction);
	op->add_id(var_id);
	impl.add(op);
	impl.builder().addCapability(spv::CapabilitySampleRateShading);
	return true;
}